

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall gl4cts::DirectStateAccess::Textures::CopyErrorsTest::Clean(CopyErrorsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  CopyErrorsTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_fbo_ms != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_ms);
    this->m_fbo_ms = 0;
  }
  if (this->m_fbo_incomplete != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_incomplete);
    this->m_fbo_incomplete = 0;
  }
  if (this->m_to_src != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_src);
    this->m_to_src = 0;
  }
  if (this->m_to_src_ms != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_src_ms);
    this->m_to_src_ms = 0;
  }
  if (this->m_to_1D_dst != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_1D_dst);
    this->m_to_1D_dst = 0;
  }
  if (this->m_to_2D_dst != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_2D_dst);
    this->m_to_2D_dst = 0;
  }
  if (this->m_to_3D_dst != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_3D_dst);
    this->m_to_3D_dst = 0;
  }
  this->m_to_invalid = 0;
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void CopyErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Cleanup. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	if (m_fbo_ms)
	{
		gl.deleteFramebuffers(1, &m_fbo_ms);

		m_fbo_ms = 0;
	}

	if (m_fbo_incomplete)
	{
		gl.deleteFramebuffers(1, &m_fbo_incomplete);

		m_fbo_incomplete = 0;
	}

	if (m_to_src)
	{
		gl.deleteTextures(1, &m_to_src);

		m_to_src = 0;
	}

	if (m_to_src_ms)
	{
		gl.deleteTextures(1, &m_to_src_ms);

		m_to_src_ms = 0;
	}

	if (m_to_1D_dst)
	{
		gl.deleteTextures(1, &m_to_1D_dst);

		m_to_1D_dst = 0;
	}

	if (m_to_2D_dst)
	{
		gl.deleteTextures(1, &m_to_2D_dst);

		m_to_2D_dst = 0;
	}

	if (m_to_3D_dst)
	{
		gl.deleteTextures(1, &m_to_3D_dst);

		m_to_3D_dst = 0;
	}

	m_to_invalid = 0;

	while (GL_NO_ERROR != gl.getError())
		;
}